

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_case.h
# Opt level: O0

void __thiscall
ut::setup_impl<agge::tests::GenericRGBXBlenderTests>::teardown
          (setup_impl<agge::tests::GenericRGBXBlenderTests> *this,GenericRGBXBlenderTests *fixture)

{
  const_iterator cVar1;
  bool bVar2;
  reference poVar3;
  code *local_50;
  __normal_iterator<void_(agge::tests::GenericRGBXBlenderTests::*const_*)(),_std::vector<void_(agge::tests::GenericRGBXBlenderTests::*)(),_std::allocator<void_(agge::tests::GenericRGBXBlenderTests::*)()>_>_>
  local_28;
  __normal_iterator<void_(agge::tests::GenericRGBXBlenderTests::*const_*)(),_std::vector<void_(agge::tests::GenericRGBXBlenderTests::*)(),_std::allocator<void_(agge::tests::GenericRGBXBlenderTests::*)()>_>_>
  local_20;
  const_iterator i;
  GenericRGBXBlenderTests *fixture_local;
  setup_impl<agge::tests::GenericRGBXBlenderTests> *this_local;
  
  i._M_current = (offset_in_GenericRGBXBlenderTests_to_subr *)fixture;
  local_20._M_current =
       (offset_in_GenericRGBXBlenderTests_to_subr *)
       std::
       vector<void_(agge::tests::GenericRGBXBlenderTests::*)(),_std::allocator<void_(agge::tests::GenericRGBXBlenderTests::*)()>_>
       ::begin(&this->_teardowns);
  while( true ) {
    local_28._M_current =
         (offset_in_GenericRGBXBlenderTests_to_subr *)
         std::
         vector<void_(agge::tests::GenericRGBXBlenderTests::*)(),_std::allocator<void_(agge::tests::GenericRGBXBlenderTests::*)()>_>
         ::end(&this->_teardowns);
    bVar2 = __gnu_cxx::operator!=(&local_20,&local_28);
    cVar1 = i;
    if (!bVar2) break;
    poVar3 = __gnu_cxx::
             __normal_iterator<void_(agge::tests::GenericRGBXBlenderTests::*const_*)(),_std::vector<void_(agge::tests::GenericRGBXBlenderTests::*)(),_std::allocator<void_(agge::tests::GenericRGBXBlenderTests::*)()>_>_>
             ::operator*(&local_20);
    local_50 = (code *)*poVar3;
    if (((ulong)local_50 & 1) != 0) {
      local_50 = *(code **)(local_50 + *(long *)((long)cVar1._M_current + poVar3[1]) + -1);
    }
    (*local_50)((long *)((long)cVar1._M_current + poVar3[1]));
    __gnu_cxx::
    __normal_iterator<void_(agge::tests::GenericRGBXBlenderTests::*const_*)(),_std::vector<void_(agge::tests::GenericRGBXBlenderTests::*)(),_std::allocator<void_(agge::tests::GenericRGBXBlenderTests::*)()>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

inline void setup_impl<Fixture>::teardown(Fixture &fixture) const
	{
		for (typename methods_list_t::const_iterator i = _teardowns.begin(); i != _teardowns.end(); ++i)
			(fixture.**i)();
	}